

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firework.cpp
# Opt level: O0

void __thiscall Firework::applyForce(Firework *this,vec2 force)

{
  bool bVar1;
  reference this_00;
  Particle *particle;
  iterator __end2;
  iterator __begin2;
  vector<Particle,_std::allocator<Particle>_> *__range2;
  Firework *this_local;
  vec2 force_local;
  
  if ((this->exploded & 1U) == 0) {
    Particle::applyForce(&this->rocket,force);
  }
  else {
    __end2 = std::vector<Particle,_std::allocator<Particle>_>::begin(&this->particles);
    particle = (Particle *)std::vector<Particle,_std::allocator<Particle>_>::end(&this->particles);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Particle_*,_std::vector<Particle,_std::allocator<Particle>_>_>
                                       *)&particle), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<Particle_*,_std::vector<Particle,_std::allocator<Particle>_>_>::
                operator*(&__end2);
      Particle::applyForce(this_00,force);
      __gnu_cxx::__normal_iterator<Particle_*,_std::vector<Particle,_std::allocator<Particle>_>_>::
      operator++(&__end2);
    }
  }
  return;
}

Assistant:

void Firework::applyForce(glm::vec2 force) {
    if (!exploded) {
        rocket.applyForce(force);
    } else {
        for (Particle& particle : particles) {
            particle.applyForce(force);
        }
    }
}